

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O3

void tcg_gen_ext_i64(TCGContext_conflict9 *tcg_ctx,TCGv_i64 ret,TCGv_i64 val,MemOp opc)

{
  TCGOp *pTVar1;
  MemOp MVar2;
  TCGOpcode opc_00;
  
  MVar2 = opc & MO_SSIZE;
  if ((MVar2 == MO_SSIZE) || ((0x77U >> MVar2 & 1) == 0)) {
    opc_00 = INDEX_op_mov_i64;
    if (ret == val) {
      return;
    }
  }
  else {
    opc_00 = *(TCGOpcode *)(&DAT_00dc7cc0 + (ulong)MVar2 * 4);
  }
  pTVar1 = tcg_emit_op_tricore(tcg_ctx,opc_00);
  pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
  pTVar1->args[1] = (TCGArg)(val + (long)tcg_ctx);
  return;
}

Assistant:

static void tcg_gen_ext_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 val, MemOp opc)
{
    switch (opc & MO_SSIZE) {
    case MO_SB:
        tcg_gen_ext8s_i64(tcg_ctx, ret, val);
        break;
    case MO_UB:
        tcg_gen_ext8u_i64(tcg_ctx, ret, val);
        break;
    case MO_SW:
        tcg_gen_ext16s_i64(tcg_ctx, ret, val);
        break;
    case MO_UW:
        tcg_gen_ext16u_i64(tcg_ctx, ret, val);
        break;
    case MO_SL:
        tcg_gen_ext32s_i64(tcg_ctx, ret, val);
        break;
    case MO_UL:
        tcg_gen_ext32u_i64(tcg_ctx, ret, val);
        break;
    default:
        tcg_gen_mov_i64(tcg_ctx, ret, val);
        break;
    }
}